

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

bool __thiscall Matrix::SwapColumns(Matrix *this,int first_column,int second_column)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int row;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  bVar3 = false;
  if (first_column != second_column) {
    lVar8 = (long)first_column;
    lVar6 = (long)second_column;
    lVar7 = 0;
    for (lVar5 = 0; lVar5 < this->n_; lVar5 = lVar5 + 1) {
      lVar1 = *(long *)((long)&(((this->elements_).
                                 super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                               super__Vector_impl_data + lVar7);
      bVar4 = operator!=((Fraction *)(lVar1 + lVar8 * 8),(Fraction *)(lVar1 + lVar6 * 8));
      if (bVar4) {
        lVar1 = *(long *)((long)&(((this->elements_).
                                   super__Vector_base<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<Fraction,_std::allocator<Fraction>_>)._M_impl.
                                 super__Vector_impl_data + lVar7);
        uVar2 = *(undefined8 *)(lVar1 + lVar8 * 8);
        *(undefined8 *)(lVar1 + lVar8 * 8) = *(undefined8 *)(lVar1 + lVar6 * 8);
        *(undefined8 *)(lVar1 + lVar6 * 8) = uVar2;
        bVar3 = true;
      }
      lVar7 = lVar7 + 0x18;
    }
  }
  return bVar3;
}

Assistant:

bool Matrix::SwapColumns(int first_column, int second_column) {
  if (first_column == second_column) {
    return false;
  }

  int result = false;
  for (int row = 0; row < n_; ++row) {
    if (elements_[row][first_column] != elements_[row][second_column]) {
      result = true;
      std::swap(elements_[row][first_column], elements_[row][second_column]);
    }
  }

  return result;
}